

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O3

void quantize_ord_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,
                        int num_rows)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  jpeg_color_quantizer *pjVar4;
  _func_void_j_decompress_ptr *p_Var5;
  long lVar6;
  JSAMPROW pJVar7;
  ulong uVar8;
  byte *pbVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (0 < num_rows) {
    uVar1 = cinfo->output_width;
    uVar2 = cinfo->out_color_components;
    pjVar4 = cinfo->cquantize;
    uVar12 = 0;
    do {
      memset(output_buf[uVar12],0,(ulong)uVar1);
      iVar3 = *(int *)((long)&pjVar4[2].color_quantize + 4);
      if (0 < (int)uVar2) {
        uVar8 = 0;
        do {
          if ((ulong)uVar1 != 0) {
            p_Var5 = (&pjVar4[2].finish_pass)[uVar8];
            lVar6 = *(long *)(pjVar4[1].finish_pass + uVar8 * 8);
            pJVar7 = output_buf[uVar12];
            pbVar9 = input_buf[uVar12] + uVar8;
            lVar10 = 0;
            uVar11 = 0;
            do {
              pJVar7[lVar10] =
                   pJVar7[lVar10] +
                   *(char *)(lVar6 + (long)*(int *)(p_Var5 + uVar11 * 4 + (long)iVar3 * 0x40) +
                                     (ulong)*pbVar9);
              pbVar9 = pbVar9 + (int)uVar2;
              uVar11 = (ulong)((int)uVar11 + 1U & 0xf);
              lVar10 = lVar10 + 1;
            } while (uVar1 != (uint)lVar10);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar2);
      }
      *(uint *)((long)&pjVar4[2].color_quantize + 4) = iVar3 + 1U & 0xf;
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)num_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
quantize_ord_dither (j_decompress_ptr cinfo, JSAMPARRAY input_buf,
		     JSAMPARRAY output_buf, int num_rows)
/* General case, with ordered dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  register JSAMPROW input_ptr;
  register JSAMPROW output_ptr;
  JSAMPROW colorindex_ci;
  int * dither;			/* points to active row of dither matrix */
  int row_index, col_index;	/* current indexes into dither matrix */
  int nc = cinfo->out_color_components;
  int ci;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    /* Initialize output values to 0 so can process components separately */
    FMEMZERO((void FAR *) output_buf[row],
	     (size_t) (width * SIZEOF(JSAMPLE)));
    row_index = cquantize->row_index;
    for (ci = 0; ci < nc; ci++) {
      input_ptr = input_buf[row] + ci;
      output_ptr = output_buf[row];
      colorindex_ci = cquantize->colorindex[ci];
      dither = cquantize->odither[ci][row_index];
      col_index = 0;

      for (col = width; col > 0; col--) {
	/* Form pixel value + dither, range-limit to 0..MAXJSAMPLE,
	 * select output value, accumulate into output code for this pixel.
	 * Range-limiting need not be done explicitly, as we have extended
	 * the colorindex table to produce the right answers for out-of-range
	 * inputs.  The maximum dither is +- MAXJSAMPLE; this sets the
	 * required amount of padding.
	 */
	*output_ptr += colorindex_ci[GETJSAMPLE(*input_ptr)+dither[col_index]];
	input_ptr += nc;
	output_ptr++;
	col_index = (col_index + 1) & ODITHER_MASK;
      }
    }
    /* Advance row index for next row */
    row_index = (row_index + 1) & ODITHER_MASK;
    cquantize->row_index = row_index;
  }
}